

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

internal * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_(internal *this,char *file,int line)

{
  char *pcVar1;
  String *in_stack_ffffffffffffff60;
  String *this_00;
  char *local_78;
  allocator local_59;
  String local_58;
  allocator local_45 [13];
  String local_38;
  char *local_28;
  char *file_name;
  char *pcStack_18;
  int line_local;
  char *file_local;
  
  local_78 = file;
  if (file == (char *)0x0) {
    local_78 = "unknown file";
  }
  local_28 = local_78;
  file_name._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)this;
  if (line < 0) {
    String::Format(&local_38,"%s:",local_78);
    pcVar1 = String::c_str(&local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar1,local_45);
    std::allocator<char>::~allocator((allocator<char> *)local_45);
    String::~String(in_stack_ffffffffffffff60);
  }
  else {
    this_00 = &local_58;
    String::Format(this_00,"%s:%d:",local_78,(ulong)(uint)line);
    pcVar1 = String::c_str(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar1,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    String::~String(this_00);
  }
  return this;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0) {
    return String::Format("%s:", file_name).c_str();
  }
#ifdef _MSC_VER
  return String::Format("%s(%d):", file_name, line).c_str();
#else
  return String::Format("%s:%d:", file_name, line).c_str();
#endif  // _MSC_VER
}